

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_visitor.h
# Opt level: O2

void __thiscall
google::protobuf::internal::
VisitImpl<google::protobuf::internal::VisitorImpl<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/command_line_interface.cc:1309:23)>_>
::Visit<google::protobuf::DescriptorProto>
          (VisitImpl<google::protobuf::internal::VisitorImpl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_compiler_command_line_interface_cc:1309:23)>_>
           *this,Descriptor *descriptor,DescriptorProto *proto)

{
  string *psVar1;
  bool bVar2;
  undefined8 in_RAX;
  EnumDescriptor *descriptor_00;
  Value<google::protobuf::internal::GenericTypeHandler<google::protobuf::EnumDescriptorProto>_>
  *proto_00;
  Value<google::protobuf::internal::GenericTypeHandler<google::protobuf::OneofDescriptorProto>_>
  *pVVar3;
  Value<google::protobuf::internal::GenericTypeHandler<google::protobuf::FieldDescriptorProto>_>
  *pVVar4;
  Descriptor *descriptor_01;
  Value<google::protobuf::internal::GenericTypeHandler<google::protobuf::DescriptorProto>_>
  *proto_01;
  Value<google::protobuf::internal::GenericTypeHandler<google::protobuf::DescriptorProto_ExtensionRange>_>
  *pVVar5;
  FieldDescriptorProto *proto_02;
  FieldDescriptorProto *proto_03;
  int i;
  int iVar6;
  undefined1 *puVar7;
  string_view file_name;
  string_view file_name_00;
  string_view file_name_01;
  
  puVar7 = (undefined1 *)(proto->field_0)._impl_.options_;
  if ((MessageOptions *)puVar7 == (MessageOptions *)0x0) {
    puVar7 = _MessageOptions_default_instance_;
  }
  psVar1 = (*(this->visitor).super_anon_class_32_4_e643f291.file)->name_;
  file_name._M_str = (char *)0x3;
  file_name._M_len = (size_t)(psVar1->_M_dataplus)._M_p;
  bVar2 = compiler::anon_unknown_5::ValidateTargetConstraints
                    ((anon_unknown_5 *)puVar7,
                     (Message *)
                     (((this->visitor).super_anon_class_32_4_e643f291.descriptor_pool)->_M_t).
                     super___uniq_ptr_impl<google::protobuf::DescriptorPool,_std::default_delete<google::protobuf::DescriptorPool>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_google::protobuf::DescriptorPool_*,_std::default_delete<google::protobuf::DescriptorPool>_>
                     ,(DescriptorPool *)
                      &((((this->visitor).super_anon_class_32_4_e643f291.error_collector)->_M_t).
                        super___uniq_ptr_impl<google::protobuf::compiler::CommandLineInterface::ErrorPrinter,_std::default_delete<google::protobuf::compiler::CommandLineInterface::ErrorPrinter>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_google::protobuf::compiler::CommandLineInterface::ErrorPrinter_*,_std::default_delete<google::protobuf::compiler::CommandLineInterface::ErrorPrinter>_>
                        .
                        super__Head_base<0UL,_google::protobuf::compiler::CommandLineInterface::ErrorPrinter_*,_false>
                       ._M_head_impl)->super_ErrorCollector,
                     (ErrorCollector *)psVar1->_M_string_length,file_name,(OptionTargetType)in_RAX);
  if (!bVar2) {
    *(this->visitor).super_anon_class_32_4_e643f291.validation_error = true;
  }
  for (iVar6 = 0; iVar6 < descriptor->enum_type_count_; iVar6 = iVar6 + 1) {
    descriptor_00 = Descriptor::enum_type(descriptor,iVar6);
    proto_00 = RepeatedPtrFieldBase::
               Mutable<google::protobuf::internal::GenericTypeHandler<google::protobuf::EnumDescriptorProto>>
                         (&(proto->field_0)._impl_.enum_type_.super_RepeatedPtrFieldBase,iVar6);
    Visit<google::protobuf::EnumDescriptorProto>(this,descriptor_00,proto_00);
  }
  for (iVar6 = 0; iVar6 < descriptor->oneof_decl_count_; iVar6 = iVar6 + 1) {
    Descriptor::oneof_decl(descriptor,iVar6);
    pVVar3 = RepeatedPtrFieldBase::
             Mutable<google::protobuf::internal::GenericTypeHandler<google::protobuf::OneofDescriptorProto>>
                       (&(proto->field_0)._impl_.oneof_decl_.super_RepeatedPtrFieldBase,iVar6);
    puVar7 = (undefined1 *)(pVVar3->field_0)._impl_.options_;
    if ((OneofOptions *)puVar7 == (OneofOptions *)0x0) {
      puVar7 = _OneofOptions_default_instance_;
    }
    psVar1 = (*(this->visitor).super_anon_class_32_4_e643f291.file)->name_;
    file_name_00._M_str = (char *)0x5;
    file_name_00._M_len = (size_t)(psVar1->_M_dataplus)._M_p;
    bVar2 = compiler::anon_unknown_5::ValidateTargetConstraints
                      ((anon_unknown_5 *)puVar7,
                       (Message *)
                       (((this->visitor).super_anon_class_32_4_e643f291.descriptor_pool)->_M_t).
                       super___uniq_ptr_impl<google::protobuf::DescriptorPool,_std::default_delete<google::protobuf::DescriptorPool>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_google::protobuf::DescriptorPool_*,_std::default_delete<google::protobuf::DescriptorPool>_>
                       ,(DescriptorPool *)
                        &((((this->visitor).super_anon_class_32_4_e643f291.error_collector)->_M_t).
                          super___uniq_ptr_impl<google::protobuf::compiler::CommandLineInterface::ErrorPrinter,_std::default_delete<google::protobuf::compiler::CommandLineInterface::ErrorPrinter>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_google::protobuf::compiler::CommandLineInterface::ErrorPrinter_*,_std::default_delete<google::protobuf::compiler::CommandLineInterface::ErrorPrinter>_>
                          .
                          super__Head_base<0UL,_google::protobuf::compiler::CommandLineInterface::ErrorPrinter_*,_false>
                         ._M_head_impl)->super_ErrorCollector,
                       (ErrorCollector *)psVar1->_M_string_length,file_name_00,
                       (OptionTargetType)in_RAX);
    if (!bVar2) {
      *(this->visitor).super_anon_class_32_4_e643f291.validation_error = true;
    }
  }
  for (iVar6 = 0; iVar6 < descriptor->field_count_; iVar6 = iVar6 + 1) {
    Descriptor::field(descriptor,iVar6);
    pVVar4 = RepeatedPtrFieldBase::
             Mutable<google::protobuf::internal::GenericTypeHandler<google::protobuf::FieldDescriptorProto>>
                       (&(proto->field_0)._impl_.field_.super_RepeatedPtrFieldBase,iVar6);
    Visit<google::protobuf::FieldDescriptorProto>(this,(FieldDescriptor *)pVVar4,proto_02);
  }
  for (iVar6 = 0; iVar6 < descriptor->nested_type_count_; iVar6 = iVar6 + 1) {
    descriptor_01 = Descriptor::nested_type(descriptor,iVar6);
    proto_01 = RepeatedPtrFieldBase::
               Mutable<google::protobuf::internal::GenericTypeHandler<google::protobuf::DescriptorProto>>
                         (&(proto->field_0)._impl_.nested_type_.super_RepeatedPtrFieldBase,iVar6);
    Visit<google::protobuf::DescriptorProto>(this,descriptor_01,proto_01);
  }
  for (iVar6 = 0; iVar6 < descriptor->extension_count_; iVar6 = iVar6 + 1) {
    Descriptor::extension(descriptor,iVar6);
    pVVar4 = RepeatedPtrFieldBase::
             Mutable<google::protobuf::internal::GenericTypeHandler<google::protobuf::FieldDescriptorProto>>
                       (&(proto->field_0)._impl_.extension_.super_RepeatedPtrFieldBase,iVar6);
    Visit<google::protobuf::FieldDescriptorProto>(this,(FieldDescriptor *)pVVar4,proto_03);
  }
  for (iVar6 = 0; iVar6 < descriptor->extension_range_count_; iVar6 = iVar6 + 1) {
    Descriptor::extension_range(descriptor,iVar6);
    pVVar5 = RepeatedPtrFieldBase::
             Mutable<google::protobuf::internal::GenericTypeHandler<google::protobuf::DescriptorProto_ExtensionRange>>
                       (&(proto->field_0)._impl_.extension_range_.super_RepeatedPtrFieldBase,iVar6);
    puVar7 = (undefined1 *)(pVVar5->field_0)._impl_.options_;
    if ((ExtensionRangeOptions *)puVar7 == (ExtensionRangeOptions *)0x0) {
      puVar7 = _ExtensionRangeOptions_default_instance_;
    }
    psVar1 = (*(this->visitor).super_anon_class_32_4_e643f291.file)->name_;
    file_name_01._M_str = (char *)0x2;
    file_name_01._M_len = (size_t)(psVar1->_M_dataplus)._M_p;
    bVar2 = compiler::anon_unknown_5::ValidateTargetConstraints
                      ((anon_unknown_5 *)puVar7,
                       (Message *)
                       (((this->visitor).super_anon_class_32_4_e643f291.descriptor_pool)->_M_t).
                       super___uniq_ptr_impl<google::protobuf::DescriptorPool,_std::default_delete<google::protobuf::DescriptorPool>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_google::protobuf::DescriptorPool_*,_std::default_delete<google::protobuf::DescriptorPool>_>
                       ,(DescriptorPool *)
                        &((((this->visitor).super_anon_class_32_4_e643f291.error_collector)->_M_t).
                          super___uniq_ptr_impl<google::protobuf::compiler::CommandLineInterface::ErrorPrinter,_std::default_delete<google::protobuf::compiler::CommandLineInterface::ErrorPrinter>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_google::protobuf::compiler::CommandLineInterface::ErrorPrinter_*,_std::default_delete<google::protobuf::compiler::CommandLineInterface::ErrorPrinter>_>
                          .
                          super__Head_base<0UL,_google::protobuf::compiler::CommandLineInterface::ErrorPrinter_*,_false>
                         ._M_head_impl)->super_ErrorCollector,
                       (ErrorCollector *)psVar1->_M_string_length,file_name_01,
                       (OptionTargetType)in_RAX);
    if (!bVar2) {
      *(this->visitor).super_anon_class_32_4_e643f291.validation_error = true;
    }
  }
  return;
}

Assistant:

void Visit(const Descriptor& descriptor, Proto&... proto) {
    visitor(descriptor, proto...);

    for (int i = 0; i < descriptor.enum_type_count(); i++) {
      Visit(*descriptor.enum_type(i), enum_type(proto, i)...);
    }

    for (int i = 0; i < descriptor.oneof_decl_count(); i++) {
      Visit(*descriptor.oneof_decl(i), oneof_decl(proto, i)...);
    }

    for (int i = 0; i < descriptor.field_count(); i++) {
      Visit(*descriptor.field(i), field(proto, i)...);
    }

    for (int i = 0; i < descriptor.nested_type_count(); i++) {
      Visit(*descriptor.nested_type(i), nested_type(proto, i)...);
    }

    for (int i = 0; i < descriptor.extension_count(); i++) {
      Visit(*descriptor.extension(i), extension(proto, i)...);
    }

    for (int i = 0; i < descriptor.extension_range_count(); i++) {
      Visit(*descriptor.extension_range(i), extension_range(proto, i)...);
    }
  }